

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_meta.cc
# Opt level: O2

void DebugMT::run(search *sch,multi_ex *ec)

{
  BaseTask local_38;
  
  local_38._with_output_string = (_func_void_search_ptr_stringstream_ptr *)0x0;
  local_38._foreach_action =
       run(Search::search&,std::vector<example*,std::allocator<example*>>&)::$_0::__invoke(Search::
       search__unsigned_long_float_unsigned_int_bool_float_;
  local_38._post_prediction =
       run(Search::search&,std::vector<example*,std::allocator<example*>>&)::$_1::__invoke(Search::
       search__unsigned_long_unsigned_int_float_;
  local_38._maybe_override_prediction =
       run(Search::search&,std::vector<example*,std::allocator<example*>>&)::$_2::__invoke(Search::
       search__unsigned_long_unsigned_int__float__;
  local_38._final_run = true;
  local_38.sch = sch;
  local_38.ec = ec;
  Search::BaseTask::Run(&local_38);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  sch.base_task(ec)
      .foreach_action(
          [](Search::search& /*sch*/, size_t t, float min_cost, action a, bool taken, float a_cost) -> void {
            cerr << "==DebugMT== foreach_action(t=" << t << ", min_cost=" << min_cost << ", a=" << a
                 << ", taken=" << taken << ", a_cost=" << a_cost << ")" << endl;
          })

      .post_prediction([](Search::search& /*sch*/, size_t t, action a, float a_cost) -> void {
        cerr << "==DebugMT== post_prediction(t=" << t << ", a=" << a << ", a_cost=" << a_cost << ")" << endl;
      })

      .maybe_override_prediction([](Search::search& /*sch*/, size_t t, action& a, float& a_cost) -> bool {
        cerr << "==DebugMT== maybe_override_prediction(t=" << t << ", a=" << a << ", a_cost=" << a_cost << ")" << endl;
        return false;
      })

      .final_run()

      .Run();
}